

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

sysbvm_tuple_t sysbvm_tuple_defaultPrintString(sysbvm_context_t *context,sysbvm_tuple_t tuple)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  sysbvm_tuple_t sVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = tuple & 0xf;
  if (uVar5 != 0 || tuple == 0) {
    if ((int)uVar5 == 0xf) {
      uVar3 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,tuple >> 4);
    }
    else {
      uVar3 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar5);
    }
  }
  else {
    uVar3 = *(ulong *)tuple;
  }
  if (uVar3 != 0) {
    uVar2 = (context->roots).typeType;
    if (((uVar2 != 0) && ((((uint)uVar2 | (uint)uVar3) & 0xf) == 0)) &&
       (uVar6 = uVar3, (*(byte *)(uVar3 + 8) & 0x80) == 0)) {
      do {
        if (uVar6 == uVar2) {
          if ((uVar5 != 0 || tuple == 0) || ((*(byte *)(tuple + 8) & 0x80) != 0)) {
            uVar5 = 0;
          }
          else {
            uVar5 = *(ulong *)(tuple + 0x10);
          }
          if (uVar5 != 0 && (uVar5 & 0xf) == 0) {
            return uVar5;
          }
          break;
        }
        puVar1 = (ulong *)(uVar6 + 0x30);
        uVar6 = *puVar1;
      } while (*puVar1 != 0);
    }
    if (((uVar3 & 0xf) == 0) && ((*(byte *)(uVar3 + 8) & 0x80) == 0)) {
      sVar4 = *(sysbvm_tuple_t *)(uVar3 + 0x10);
    }
    else {
      sVar4 = 0;
    }
    if ((sVar4 & 0xf) == 0 && sVar4 != 0) {
      sVar4 = sysbvm_string_createWithPrefix(context,"a ",sVar4);
      return sVar4;
    }
  }
  sVar4 = sysbvm_string_createWithCString(context,"TODO: defaultPrintString");
  return sVar4;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_tuple_defaultPrintString(sysbvm_context_t *context, sysbvm_tuple_t tuple)
{
    sysbvm_tuple_t type = sysbvm_tuple_getType(context, tuple);
    if(type != SYSBVM_NULL_TUPLE)
    {
        // Is the tuple a type?
        if(sysbvm_type_isDirectSubtypeOf(type, context->roots.typeType))
        {
            sysbvm_tuple_t thisTypeName = sysbvm_type_getName(tuple);
            if(sysbvm_tuple_isNonNullPointer(thisTypeName))   
                return thisTypeName;
        }

        sysbvm_tuple_t typeName = sysbvm_type_getName(type);
        if(sysbvm_tuple_isNonNullPointer(typeName))
            return sysbvm_string_createWithPrefix(context, "a ", typeName);
    }

    return sysbvm_string_createWithCString(context, "TODO: defaultPrintString");
}